

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O3

void appendRowsToLpVectors
               (HighsLp *lp,HighsInt num_new_row,vector<double,_std::allocator<double>_> *rowLower,
               vector<double,_std::allocator<double>_> *rowUpper)

{
  pointer pbVar1;
  pointer pbVar2;
  pointer pbVar3;
  long lVar4;
  size_type __new_size;
  ulong uVar5;
  
  if (num_new_row != 0) {
    __new_size = (long)num_new_row + (long)lp->num_row_;
    std::vector<double,_std::allocator<double>_>::resize(&lp->row_lower_,__new_size);
    std::vector<double,_std::allocator<double>_>::resize(&lp->row_upper_,__new_size);
    pbVar1 = (lp->row_names_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (lp->row_names_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar2 != pbVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize(&lp->row_names_,__new_size);
    }
    if (0 < num_new_row) {
      uVar5 = 0;
      do {
        lVar4 = (long)lp->num_row_ + uVar5;
        (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar4] =
             (rowLower->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar5];
        (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar4] =
             (rowUpper->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar5];
        if (pbVar2 != pbVar1) {
          pbVar3 = (lp->row_names_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          std::__cxx11::string::_M_replace
                    ((ulong)(pbVar3 + lVar4),0,(char *)pbVar3[lVar4]._M_string_length,0x3cbf27);
        }
        uVar5 = uVar5 + 1;
      } while ((uint)num_new_row != uVar5);
    }
  }
  return;
}

Assistant:

void appendRowsToLpVectors(HighsLp& lp, const HighsInt num_new_row,
                           const vector<double>& rowLower,
                           const vector<double>& rowUpper) {
  assert(num_new_row >= 0);
  if (num_new_row == 0) return;
  HighsInt new_num_row = lp.num_row_ + num_new_row;
  lp.row_lower_.resize(new_num_row);
  lp.row_upper_.resize(new_num_row);
  bool have_names = (lp.row_names_.size() != 0);
  if (have_names) lp.row_names_.resize(new_num_row);

  for (HighsInt new_row = 0; new_row < num_new_row; new_row++) {
    HighsInt iRow = lp.num_row_ + new_row;
    lp.row_lower_[iRow] = rowLower[new_row];
    lp.row_upper_[iRow] = rowUpper[new_row];
    // Cannot guarantee to create unique names, so name is blank
    if (have_names) lp.row_names_[iRow] = "";
  }
}